

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

ONX_ModelComponentList * __thiscall
ON_ClassArray<ONX_Model::ONX_ModelComponentList>::AppendNew
          (ON_ClassArray<ONX_Model::ONX_ModelComponentList> *this)

{
  ONX_ModelComponentList *pOVar1;
  int iVar2;
  
  iVar2 = this->m_count;
  if (iVar2 == this->m_capacity) {
    iVar2 = NewCapacity(this);
    Reserve(this,(long)iVar2);
  }
  else {
    pOVar1 = this->m_a;
    pOVar1[iVar2].m_component_type = Unset;
    *(undefined8 *)&pOVar1[iVar2].m_count = 0;
    *(undefined8 *)(&pOVar1[iVar2].m_count + 2) = 0;
    *(undefined4 *)((long)&pOVar1[iVar2].m_last_mcr_link + 4) = 0;
  }
  iVar2 = this->m_count;
  this->m_count = iVar2 + 1;
  return this->m_a + iVar2;
}

Assistant:

T& ON_ClassArray<T>::AppendNew()
{
  if ( m_count == m_capacity ) 
  {
    int newcapacity = NewCapacity();
    Reserve( newcapacity );
  }
  else
  {
    // First destroy what's there ..
    DestroyElement(m_a[m_count]);
    // and then get a properly initialized element
    ConstructDefaultElement(&m_a[m_count]);
  }
  return m_a[m_count++];
}